

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::MoveIfCurrentTargetIsLocal(SQCompiler *this)

{
  bool bVar1;
  SQFuncState *this_00;
  SQInteger arg2;
  SQFuncState *in_RDI;
  SQInteger unaff_retaddr;
  SQOpcode in_stack_0000000c;
  SQFuncState *in_stack_00000010;
  SQInteger trg;
  SQUnsignedInteger in_stack_ffffffffffffffe0;
  SQFuncState *arg1;
  
  arg1 = in_RDI;
  this_00 = (SQFuncState *)SQFuncState::TopTarget((SQFuncState *)0x11a5cc);
  bVar1 = SQFuncState::IsLocal(in_RDI,in_stack_ffffffffffffffe0);
  if (bVar1) {
    arg2 = SQFuncState::PopTarget(this_00);
    SQFuncState::PushTarget(in_RDI,(SQInteger)(in_RDI->_vlocals)._vals);
    SQFuncState::AddInstruction
              (in_stack_00000010,in_stack_0000000c,unaff_retaddr,(SQInteger)arg1,arg2,
               (SQInteger)in_RDI);
  }
  return;
}

Assistant:

void MoveIfCurrentTargetIsLocal() {
        SQInteger trg = _fs->TopTarget();
        if(_fs->IsLocal(trg)) {
            trg = _fs->PopTarget(); //pops the target and moves it
            _fs->AddInstruction(_OP_MOVE, _fs->PushTarget(), trg);
        }
    }